

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageNextXrDestroyAction(XrAction action)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_action_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  XrResult result;
  XrAction action_local;
  
  pVar2 = HandleInfo<XrAction_T_*>::getWithInstanceInfo(&g_action_info,action);
  XVar1 = (*(pVar2.second)->dispatch_table->DestroyAction)(action);
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    HandleInfoBase<XrAction_T_*,_GenValidUsageXrHandleInfo>::erase
              (&g_action_info.super_HandleInfoBase<XrAction_T_*,_GenValidUsageXrHandleInfo>,action);
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrDestroyAction(
    XrAction action) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_action_info.getWithInstanceInfo(action);
        GenValidUsageXrHandleInfo *gen_action_info = info_with_instance.first;
        (void)gen_action_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->DestroyAction(action);
        if (XR_SUCCEEDED(result)) {
            g_action_info.erase(action);
        }
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}